

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O1

BCPos bcemit_jmp(FuncState *fs)

{
  BCPos l2;
  BCPos BVar1;
  BCPos j;
  uint local_1c;
  
  l2 = fs->jpc;
  BVar1 = fs->pc;
  local_1c = BVar1 - 1;
  fs->jpc = 0xffffffff;
  if (((int)local_1c < (int)fs->lasttarget) || ((char)fs->bcbase[local_1c].ins != '2')) {
    local_1c = bcemit_INS(fs,fs->freereg << 8 | 0x7fff0058);
  }
  else {
    *(undefined2 *)((long)&fs->bcbase[local_1c].ins + 2) = 0x7fff;
    fs->lasttarget = BVar1;
  }
  jmp_append(fs,&local_1c,l2);
  return local_1c;
}

Assistant:

static BCPos bcemit_jmp(FuncState *fs)
{
  BCPos jpc = fs->jpc;
  BCPos j = fs->pc - 1;
  BCIns *ip = &fs->bcbase[j].ins;
  fs->jpc = NO_JMP;
  if ((int32_t)j >= (int32_t)fs->lasttarget && bc_op(*ip) == BC_UCLO) {
    setbc_j(ip, NO_JMP);
    fs->lasttarget = j+1;
  } else {
    j = bcemit_AJ(fs, BC_JMP, fs->freereg, NO_JMP);
  }
  jmp_append(fs, &j, jpc);
  return j;
}